

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O2

void __thiscall
wabt::anon_unknown_1::WatWriter::WriteName(WatWriter *this,string_view str,NextChar next_char)

{
  long lVar1;
  byte *pbVar2;
  char *src;
  long lVar3;
  size_t sVar4;
  size_t size;
  long lVar5;
  string valid_str;
  
  src = str._M_str;
  size = str._M_len;
  if ((size == 0) || (*src != '$')) {
    __assert_fail("!str.empty() && str.front() == \'$\'",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/wat-writer.cc"
                  ,0x13d,
                  "void wabt::(anonymous namespace)::WatWriter::WriteName(std::string_view, NextChar)"
                 );
  }
  lVar5 = 0;
  lVar3 = 0;
  for (lVar1 = (long)size >> 2; 0 < lVar1; lVar1 = lVar1 + -1) {
    if ((anonymous_namespace)::s_valid_name_chars[(byte)src[lVar5 * 4]] == '\0') {
      pbVar2 = (byte *)(src + -lVar3);
      goto LAB_0018f1c9;
    }
    if ((anonymous_namespace)::s_valid_name_chars[(byte)src[lVar5 * 4 + 1]] == '\0') {
      pbVar2 = (byte *)(src + (1 - lVar3));
      goto LAB_0018f1c9;
    }
    if ((anonymous_namespace)::s_valid_name_chars[(byte)src[lVar5 * 4 + 2]] == '\0') {
      pbVar2 = (byte *)(src + (2 - lVar3));
      goto LAB_0018f1c9;
    }
    if ((anonymous_namespace)::s_valid_name_chars[(byte)src[lVar5 * 4 + 3]] == '\0') {
      pbVar2 = (byte *)(src + (3 - lVar3));
      goto LAB_0018f1c9;
    }
    lVar3 = lVar3 + -4;
    lVar5 = lVar5 + 1;
  }
  pbVar2 = (byte *)(src + -lVar3);
  lVar1 = size + lVar3;
  if (lVar1 == 1) {
LAB_0018f26b:
    if ((anonymous_namespace)::s_valid_name_chars[*pbVar2] == '\0') goto LAB_0018f1c9;
  }
  else {
    if (lVar1 == 3) {
      if ((anonymous_namespace)::s_valid_name_chars[(byte)src[lVar5 * 4]] != '\0') {
        pbVar2 = (byte *)(src + (1 - lVar3));
        goto LAB_0018f25b;
      }
    }
    else {
      if (lVar1 != 2) goto LAB_0018f278;
LAB_0018f25b:
      if ((anonymous_namespace)::s_valid_name_chars[*pbVar2] != '\0') {
        pbVar2 = pbVar2 + 1;
        goto LAB_0018f26b;
      }
    }
LAB_0018f1c9:
    if (pbVar2 != (byte *)(src + size)) {
      valid_str._M_dataplus._M_p = (pointer)&valid_str.field_2;
      valid_str._M_string_length = 0;
      valid_str.field_2._M_local_buf[0] = '\0';
      for (sVar4 = 0; size != sVar4; sVar4 = sVar4 + 1) {
        std::__cxx11::string::push_back((char)&valid_str);
      }
      WriteDataWithNextChar(this,valid_str._M_dataplus._M_p,valid_str._M_string_length);
      std::__cxx11::string::_M_dispose();
      goto LAB_0018f286;
    }
  }
LAB_0018f278:
  WriteDataWithNextChar(this,src,size);
LAB_0018f286:
  this->next_char_ = next_char;
  return;
}

Assistant:

void WatWriter::WriteNextChar() {
  switch (next_char_) {
    case NextChar::Space:
      stream_->WriteChar(' ');
      break;
    case NextChar::Newline:
    case NextChar::ForceNewline:
      stream_->WriteChar('\n');
      WriteIndent();
      break;
    case NextChar::None:
      break;
  }
  next_char_ = NextChar::None;
}